

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QString * makeString(QString *__return_storage_ptr__,QCborContainerPrivate *d,qsizetype idx,
                    ConversionMode mode)

{
  Element *pEVar1;
  Type t;
  Element *idx_00;
  QCborContainerPrivate *pQVar2;
  QArrayData *pQVar3;
  QCborContainerPrivate *pQVar4;
  qsizetype qVar5;
  Int IVar6;
  QString *pQVar7;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  QCborValue local_38;
  QString *local_18;
  
  local_18 = *(QString **)(in_FS_OFFSET + 0x28);
  idx_00 = (d->elements).d.ptr;
  pEVar1 = idx_00 + idx;
  t = idx_00[idx].type;
  if (t < False) {
    if (t < String) {
      if (t == Invalid) {
        pQVar7 = *(QString **)(in_FS_OFFSET + 0x28);
        if (pQVar7 == local_18) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).size = 0;
          return pQVar7;
        }
        goto LAB_002ec4bb;
      }
      if (t == Integer) {
        if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
          pQVar7 = QString::number(__return_storage_ptr__,(pEVar1->field_0).value,10);
          return pQVar7;
        }
        goto LAB_002ec4bb;
      }
      if (t != ByteArray) goto LAB_002ec391;
      if (mode != FromVariantToJson) {
        if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
          pQVar7 = encodeByteArray(__return_storage_ptr__,(QCborContainerPrivate *)(d->data).d.ptr,
                                   (qsizetype)idx_00,idx);
          return pQVar7;
        }
        goto LAB_002ec4bb;
      }
LAB_002ec2de:
      if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
        pQVar7 = QCborContainerPrivate::stringAt(__return_storage_ptr__,d,idx);
        return pQVar7;
      }
    }
    else {
      if (t < Map) {
        if (t == String) goto LAB_002ec2de;
        if (t == Array) goto LAB_002ec31d;
      }
      else {
        if (t == Map) {
LAB_002ec31d:
          QCborContainerPrivate::valueAt(&local_38,d,idx);
          QCborValue::toDiagnosticNotation
                    (__return_storage_ptr__,(QCborValue *)&local_38,(DiagnosticNotationOptions)0x0);
          QCborValue::~QCborValue((QCborValue *)&local_38);
          goto LAB_002ec3ea;
        }
        if (t == Tag) goto LAB_002ec172;
      }
LAB_002ec391:
      if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
        pQVar7 = simpleTypeString(__return_storage_ptr__,t);
        return pQVar7;
      }
    }
    goto LAB_002ec4bb;
  }
  switch(t) {
  case False:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"false";
    (__return_storage_ptr__->d).size = 5;
    break;
  case True:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    pcVar8 = L"true";
    goto LAB_002ec3de;
  case Null:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    pcVar8 = L"null";
LAB_002ec3de:
    (__return_storage_ptr__->d).ptr = pcVar8;
    (__return_storage_ptr__->d).size = 4;
    break;
  case Undefined:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"undefined";
    (__return_storage_ptr__->d).size = 9;
    break;
  default:
    if ((0x25 < (uint)(t + 0xffff0000)) ||
       ((0x2900000001U >> ((ulong)(uint)(t + 0xffff0000) & 0x3f) & 1) == 0)) {
      if (t == Double) {
        if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
          pQVar7 = QString::number(__return_storage_ptr__,(double)pEVar1->field_0,'g',6);
          return pQVar7;
        }
        goto LAB_002ec4bb;
      }
      goto LAB_002ec391;
    }
LAB_002ec172:
    IVar6 = (pEVar1->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
            super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    pQVar2 = (pEVar1->field_0).container;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    if ((pQVar2 != (QCborContainerPrivate *)0x0 && (IVar6 & 1) != 0) &&
       ((pQVar2->elements).d.size == 2)) {
      maybeEncodeTag((QString *)&local_38,pQVar2);
      pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pQVar4 = (QCborContainerPrivate *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = (Data *)local_38.n;
      (__return_storage_ptr__->d).ptr = (char16_t *)local_38.container;
      qVar5 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_38._16_8_;
      local_38.n = (qint64)pQVar3;
      local_38.container = pQVar4;
      local_38._16_8_ = qVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) {
        makeString((QString *)&local_38,pQVar2,1,FromRaw);
        pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        pQVar2 = (QCborContainerPrivate *)(__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = (Data *)local_38.n;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_38.container;
        qVar5 = (__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_38._16_8_;
        local_38.n = (qint64)pQVar3;
        local_38.container = pQVar2;
        local_38._16_8_ = qVar5;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,2,0x10);
          }
        }
      }
    }
  }
LAB_002ec3ea:
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
LAB_002ec4bb:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE static QString makeString(const QCborContainerPrivate *d, qsizetype idx,
                                         ConversionMode mode)
{
    const auto &e = d->elements.at(idx);

    switch (e.type) {
    case QCborValue::Integer:
        return QString::number(qint64(e.value));

    case QCborValue::Double:
        return QString::number(e.fpvalue());

    case QCborValue::ByteArray:
        return mode == ConversionMode::FromVariantToJson
                ? d->stringAt(idx)
                : encodeByteArray(d, idx, QCborTag(QCborKnownTags::ExpectedBase64url));

    case QCborValue::String:
        return d->stringAt(idx);

    case QCborValue::Array:
    case QCborValue::Map:
#if defined(QT_BOOTSTRAPPED)
        Q_UNREACHABLE_RETURN(QString());
#else
        return d->valueAt(idx).toDiagnosticNotation(QCborValue::Compact);
#endif

    case QCborValue::SimpleType:
        break;

    case QCborValue::False:
        return QStringLiteral("false");

    case QCborValue::True:
        return QStringLiteral("true");

    case QCborValue::Null:
        return QStringLiteral("null");

    case QCborValue::Undefined:
        return QStringLiteral("undefined");

    case QCborValue::Invalid:
        return QString();

    case QCborValue::Tag:
    case QCborValue::DateTime:
    case QCborValue::Url:
    case QCborValue::RegularExpression:
    case QCborValue::Uuid:
        return encodeTag(e.flags & Element::IsContainer ? e.container : nullptr);
    }

    // maybe it's a simple type
    return simpleTypeString(e.type);
}